

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

void __thiscall
vkt::api::anon_unknown_1::CreateThread<vkt::api::(anonymous_namespace)::GraphicsPipeline>::runThread
          (CreateThread<vkt::api::(anonymous_namespace)::GraphicsPipeline> *this)

{
  Parameters *in_RCX;
  int iVar1;
  ulong uVar2;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_70;
  Move<vk::Handle<(vk::HandleType)18>_> local_58;
  
  iVar1 = 0;
  uVar2 = 0;
  do {
    if ((int)(uVar2 / 0x14) * 0x14 + iVar1 == 0) {
      de::SpinBarrier::sync((this->super_ThreadGroupThread).m_barrier);
    }
    GraphicsPipeline::create(&local_58,this->m_env,this->m_resources,in_RCX);
    DStack_70.m_device =
         local_58.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
    DStack_70.m_allocator =
         local_58.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
    DStack_70.m_deviceIface =
         local_58.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
    if (local_58.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                (&DStack_70,
                 (VkPipeline)
                 local_58.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
    }
    uVar2 = (ulong)((int)uVar2 + 1);
    iVar1 = iVar1 + -1;
  } while (iVar1 != -100);
  return;
}

Assistant:

void runThread (void)
	{
		const int	numIters			= getCreateCount<Object>();
		const int	itersBetweenSyncs	= numIters / 5;

		DE_ASSERT(itersBetweenSyncs > 0);

		for (int iterNdx = 0; iterNdx < numIters; iterNdx++)
		{
			// Sync every Nth iteration to make entering driver at the same time more likely
			if ((iterNdx % itersBetweenSyncs) == 0)
				barrier();

			{
				Unique<typename Object::Type>	obj	(Object::create(m_env, m_resources, m_params));
			}
		}
	}